

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# surface_mesh.cpp
# Opt level: O2

SurfaceParameterizationQuantity * __thiscall
polyscope::SurfaceMesh::getParameterization(SurfaceMesh *this,string *name)

{
  QuantityType *pQVar1;
  SurfaceParameterizationQuantity *pSVar2;
  string local_30;
  
  std::__cxx11::string::string((string *)&local_30,(string *)name);
  pQVar1 = QuantityStructure<polyscope::SurfaceMesh>::getQuantity
                     (&this->super_QuantityStructure<polyscope::SurfaceMesh>,&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  if (pQVar1 == (QuantityType *)0x0) {
    pSVar2 = (SurfaceParameterizationQuantity *)0x0;
  }
  else {
    pSVar2 = (SurfaceParameterizationQuantity *)
             __dynamic_cast(pQVar1,&SurfaceMeshQuantity::typeinfo,
                            &SurfaceParameterizationQuantity::typeinfo,0);
  }
  return pSVar2;
}

Assistant:

SurfaceParameterizationQuantity* SurfaceMesh::getParameterization(std::string name) {
  SurfaceMeshQuantity* newQ = this->getQuantity(name);
  SurfaceParameterizationQuantity* param = dynamic_cast<SurfaceParameterizationQuantity*>(newQ);
  return param;
}